

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_EQ_RANGE_Test::Body
          (iu_SyntaxTest_x_iutest_x_EQ_RANGE_Test *this)

{
  Fixed *pFVar1;
  int (*in_R9) [5];
  AssertionResult iutest_ar;
  iuCodeMessage local_1f8;
  int b [5];
  int a [5];
  Fixed local_190;
  
  a[0] = 0;
  a[1] = 1;
  a[2] = 2;
  a[3] = 3;
  b[4] = 4;
  b[0] = 0;
  b[1] = 1;
  b[2] = 2;
  b[3] = 3;
  a[4] = b[4];
  iuutil::CmpHelperEqRange<int[5],int[5]>(&iutest_ar,(iuutil *)0x314f7e,"b",(char *)a,&b,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,5);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x8c,iutest_ar.m_message._M_dataplus._M_p);
    local_1f8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f8,pFVar1);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    iuutil::CmpHelperEqRange<int[5],int[5]>(&iutest_ar,(iuutil *)0x314f7e,"b",(char *)a,&b,in_R9);
    if (iutest_ar.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,5);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x8e,iutest_ar.m_message._M_dataplus._M_p);
      local_1f8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f8,pFVar1);
      std::__cxx11::string::~string((string *)&local_1f8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iuutil::CmpHelperEqRange<int[5],int[5]>(&iutest_ar,(iuutil *)0x314f7e,"b",(char *)a,&b,in_R9);
    if (iutest_ar.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,5);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x90,iutest_ar.m_message._M_dataplus._M_p);
      local_1f8._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f8,pFVar1);
      std::__cxx11::string::~string((string *)&local_1f8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iuutil::CmpHelperEqRange<int[5],int[5]>(&iutest_ar,(iuutil *)0x314f7e,"b",(char *)a,&b,in_R9);
    if (iutest_ar.m_result != false) goto LAB_002d7a5e;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,5);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x92,iutest_ar.m_message._M_dataplus._M_p);
    local_1f8._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f8,pFVar1);
  }
  std::__cxx11::string::~string((string *)&local_1f8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_002d7a5e:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(SyntaxTest, EQ_RANGE)
{
    int a[] = { 0, 1, 2, 3, 4 };
    int b[] = { 0, 1, 2, 3, 4 };

    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_ASSERT_EQ_RANGE(a, b) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_EXPECT_EQ_RANGE(a, b) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_INFORM_EQ_RANGE(a, b) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_ASSUME_EQ_RANGE(a, b) << size;
}